

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

Expression *
slang::ast::DistExpression::fromSyntax
          (Compilation *comp,ExpressionOrDistSyntax *syntax,ASTContext *context)

{
  undefined2 uVar1;
  LanguageVersion LVar2;
  DistConstraintListSyntax *pDVar3;
  SyntaxNode *pSVar4;
  SyntaxNode *pSVar5;
  Type *pTVar6;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  Compilation *compilation;
  bool bVar7;
  bool bVar8;
  int iVar9;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar10;
  Diagnostic *pDVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DistExpression *expr;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *src;
  undefined4 uVar13;
  Kind KVar14;
  ulong uVar15;
  long lVar16;
  SourceRange sourceRange;
  string_view arg;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL> items;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffe28;
  DistItem local_1c0;
  ExpressionOrDistSyntax *local_1a0;
  Compilation *local_198;
  long local_190;
  _Storage<slang::ast::DistExpression::DistWeight,_true> local_188;
  char local_178;
  Expression *local_170;
  ExpressionSyntax *local_168;
  pointer ppEStack_160;
  long *local_158;
  undefined8 local_150;
  undefined8 local_148;
  long local_140 [5];
  ExpressionSyntax *local_118;
  pointer ppEStack_110;
  undefined8 local_108;
  ExpressionSyntax local_100;
  SourceRange local_d8;
  SmallVectorBase<slang::ast::DistExpression::DistItem> local_c8 [2];
  Expression *pEVar12;
  
  local_118 = &local_100;
  ppEStack_110 = (pointer)0x0;
  local_108 = 5;
  pDVar3 = (syntax->distribution).ptr;
  uVar15 = (pDVar3->items).elements._M_extent._M_extent_value + 1;
  local_198 = comp;
  if (1 < uVar15) {
    uVar15 = uVar15 >> 1;
    lVar16 = 0;
    do {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((pDVar3->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar16));
      if ((*ppSVar10)->kind == DistItem) {
        local_c8[0].data_ = *(pointer *)(*ppSVar10 + 1);
        SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
        emplace_back<slang::syntax::ExpressionSyntax_const*>
                  ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_118,
                   (ExpressionSyntax **)local_c8);
      }
      lVar16 = lVar16 + 0x30;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  LVar2 = (local_198->options).languageVersion;
  local_158 = local_140;
  local_150 = 0;
  local_148 = 5;
  local_168 = local_118;
  ppEStack_160 = ppEStack_110;
  expressions_00._M_extent._M_extent_value = (size_t)&local_158;
  expressions_00._M_ptr = ppEStack_110;
  local_1a0 = syntax;
  bVar7 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0x8a,(ushort)((int)LVar2 < 1),false,false,
                     true,SUB81((syntax->expr).ptr,0),local_118,expressions_00,
                     in_stack_fffffffffffffe28);
  bVar7 = !bVar7;
  pEVar12 = (Expression *)*local_158;
  src = extraout_RDX;
  if ((0 < (int)LVar2 && !bVar7) &&
     (bVar8 = Type::isNumeric((pEVar12->type).ptr), src = extraout_RDX_00, !bVar8)) {
    pDVar11 = ASTContext::addDiag(context,(DiagCode)0x270007,pEVar12->sourceRange);
    pDVar11 = ast::operator<<(pDVar11,(pEVar12->type).ptr);
    bVar7 = true;
    arg._M_str = "dist";
    arg._M_len = 4;
    Diagnostic::operator<<(pDVar11,arg);
    src = extraout_RDX_01;
  }
  local_178 = '\0';
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 4;
  pDVar3 = (local_1a0->distribution).ptr;
  uVar15 = (pDVar3->items).elements._M_extent._M_extent_value + 1;
  local_170 = pEVar12;
  if (1 < uVar15) {
    uVar15 = uVar15 >> 1;
    local_190 = 1;
    lVar16 = 0;
    do {
      ppSVar10 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((pDVar3->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar16));
      pSVar4 = *ppSVar10;
      if (pSVar4->kind == DistItem) {
        local_1c0.value = (Expression *)local_158[local_190];
        local_1c0.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
             false;
        pSVar4 = pSVar4[1].parent;
        if (pSVar4 != (SyntaxNode *)0x0) {
          uVar1 = (undefined2)pSVar4[1].kind;
          if (uVar1 == ArithmeticShiftRightExpression) {
LAB_0043ae25:
            uVar13 = 1;
          }
          else {
            uVar13 = 0;
            if ((uVar1 == ArithmeticRightShiftAssignmentExpression) &&
               (uVar13 = 0, *(short *)&pSVar4[1].previewNode == 0x1a)) goto LAB_0043ae25;
          }
          iVar9 = Expression::bind((int)pSVar4[2].parent,(sockaddr *)context,0);
          pEVar12 = (Expression *)CONCAT44(extraout_var,iVar9);
          bVar8 = ASTContext::requireIntegral(context,pEVar12);
          if (!bVar8) {
            bVar7 = true;
          }
          local_1c0.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload
          ._M_value.kind = uVar13;
          local_1c0.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload
          ._M_value.expr = pEVar12;
          if (local_1c0.weight.
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged !=
              true) {
            local_1c0.weight.
            super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged = true;
          }
        }
        if ((local_1c0.value)->kind == ValueRange) {
          pTVar6 = (Type *)((local_1c0.value[1].type.ptr)->super_Symbol).name._M_len;
          if (pTVar6->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar6);
          }
          if ((((pTVar6->canonical->super_Symbol).kind == FloatingType) &&
              (((local_1c0.weight.
                 super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload
                 .super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged !=
                 true || (local_1c0.weight.
                          super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
                          _M_payload.
                          super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
                          _M_payload._M_value.kind != PerRange)) &&
               (pDVar11 = ASTContext::addDiag(context,(DiagCode)0x490007,
                                              (local_1c0.value)->sourceRange),
               local_1c0.weight.
               super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged ==
               true)))) &&
             (local_1c0.weight.
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
              _M_value.expr != (Expression *)0x0)) {
            Diagnostic::operator<<
                      (pDVar11,(local_1c0.weight.
                                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>
                                ._M_payload._M_value.expr)->sourceRange);
          }
        }
        SmallVectorBase<slang::ast::DistExpression::DistItem>::
        emplace_back<slang::ast::DistExpression::DistItem&>(local_c8,&local_1c0);
        local_190 = local_190 + 1;
        src = extraout_RDX_05;
      }
      else {
        pSVar5 = pSVar4[1].previewNode;
        src = extraout_RDX_02;
        if (pSVar5 != (SyntaxNode *)0x0) {
          if (local_178 == '\x01') {
            sourceRange = slang::syntax::SyntaxNode::sourceRange(pSVar4);
            pDVar11 = ASTContext::addDiag(context,(DiagCode)0x750007,sourceRange);
            Diagnostic::addNote(pDVar11,(DiagCode)0xc0001,(local_188._M_value.expr)->sourceRange);
            src = extraout_RDX_03;
          }
          else {
            uVar1 = (undefined2)pSVar5[1].kind;
            if (uVar1 == ArithmeticShiftRightExpression) {
LAB_0043aeda:
              KVar14 = PerRange;
            }
            else {
              KVar14 = PerValue;
              if ((uVar1 == ArithmeticRightShiftAssignmentExpression) &&
                 (KVar14 = PerValue, *(short *)&pSVar5[1].previewNode == 0x1a)) goto LAB_0043aeda;
            }
            iVar9 = Expression::bind((int)pSVar5[2].parent,(sockaddr *)context,0);
            pEVar12 = (Expression *)CONCAT44(extraout_var_00,iVar9);
            bVar8 = ASTContext::requireIntegral(context,pEVar12);
            if (!bVar8) {
              bVar7 = true;
            }
            src = extraout_RDX_04;
            local_188._M_value.kind = KVar14;
            local_188._M_value.expr = pEVar12;
            if (local_178 != '\x01') {
              local_178 = '\x01';
            }
          }
        }
      }
      lVar16 = lVar16 + 0x30;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  compilation = local_198;
  pTVar6 = local_198->voidType;
  iVar9 = SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
                    (local_c8,(EVP_PKEY_CTX *)local_198,src);
  local_1c0.value = (Expression *)CONCAT44(extraout_var_01,iVar9);
  local_d8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_1a0);
  expr = BumpAllocator::
         emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,std::optional<slang::ast::DistExpression::DistWeight>&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,pTVar6,local_170,
                    (span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)&local_1c0
                    ,(optional<slang::ast::DistExpression::DistWeight> *)&local_188._M_value,
                    &local_d8);
  if (bVar7) {
    expr = (DistExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
    operator_delete(local_c8[0].data_);
  }
  if (local_158 != local_140) {
    operator_delete(local_158);
  }
  if (local_118 != &local_100) {
    operator_delete(local_118);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& DistExpression::fromSyntax(Compilation& comp, const ExpressionOrDistSyntax& syntax,
                                       const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto item : syntax.distribution->items) {
        if (item->kind == SyntaxKind::DistItem)
            expressions.push_back(item->as<DistItemSyntax>().range);
    }

    const bool allowReal = comp.languageVersion() >= LanguageVersion::v1800_2023;

    SmallVector<const Expression*> bound;
    bool bad = !bindMembershipExpressions(
        context, TokenKind::DistKeyword, /* requireIntegral */ !allowReal,
        /* unwrapUnpacked */ false, /* allowTypeReferences */ false,
        /* allowValueRange */ true, *syntax.expr, expressions, bound);

    auto& pred = *bound[0];
    if (allowReal && !bad) {
        if (!pred.type->isNumeric()) {
            context.addDiag(diag::BadSetMembershipType, pred.sourceRange) << *pred.type << "dist"sv;
            bad = true;
        }
    }

    auto createWeight = [&](const DistWeightSyntax& weight) {
        auto weightKind = DistWeight::PerValue;
        if (weight.op.kind == TokenKind::ColonSlash ||
            (weight.op.kind == TokenKind::Colon && weight.extraOp.kind == TokenKind::Slash)) {
            weightKind = DistWeight::PerRange;
        }

        auto& weightExpr = Expression::bind(*weight.expr, context);
        if (!context.requireIntegral(weightExpr))
            bad = true;

        return DistWeight{weightKind, &weightExpr};
    };

    std::optional<DistWeight> defaultWeight;
    SmallVector<DistItem, 4> items;
    size_t index = 1;
    for (auto item : syntax.distribution->items) {
        if (item->kind != SyntaxKind::DistItem) {
            if (auto weight = item->as<DefaultDistItemSyntax>().weight) {
                if (defaultWeight) {
                    auto& diag = context.addDiag(diag::MultipleDefaultDistWeight,
                                                 item->sourceRange());
                    diag.addNote(diag::NotePreviousUsage, defaultWeight->expr->sourceRange);
                }
                else {
                    defaultWeight = createWeight(*weight);
                }
            }
            continue;
        }

        DistItem di{*bound[index++], {}};
        if (auto weight = item->as<DistItemSyntax>().weight)
            di.weight = createWeight(*weight);

        if (di.value.kind == ExpressionKind::ValueRange &&
            di.value.as<ValueRangeExpression>().left().type->isFloating() &&
            (!di.weight || di.weight->kind != DistWeight::PerRange)) {
            auto& diag = context.addDiag(diag::DistRealRangeWeight, di.value.sourceRange);
            if (di.weight && di.weight->expr)
                diag << di.weight->expr->sourceRange;
        }

        items.emplace_back(di);
    }

    auto result = comp.emplace<DistExpression>(comp.getVoidType(), pred, items.copy(comp),
                                               defaultWeight, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    return *result;
}